

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O3

string * __thiscall
re2c::InputAPI::expr_peek_save_abi_cxx11_(string *__return_storage_ptr__,InputAPI *this)

{
  ulong *puVar1;
  size_type *psVar2;
  pointer pcVar3;
  opt_t *poVar4;
  undefined8 *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  undefined8 uStack_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  string local_60;
  string local_40;
  
  poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  pcVar3 = (poVar4->yych)._M_dataplus._M_p;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar3,pcVar3 + (poVar4->yych)._M_string_length);
  std::__cxx11::string::append((char *)&local_80);
  Opt::yychConversion_abi_cxx11_(&local_40,(Opt *)&opts);
  uVar6 = 0xf;
  if (local_80 != local_70) {
    uVar6 = local_70[0];
  }
  if (uVar6 < local_40._M_string_length + local_78) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      uVar7 = local_40.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_40._M_string_length + local_78) goto LAB_00120414;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,(ulong)local_80);
  }
  else {
LAB_00120414:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_40._M_dataplus._M_p);
  }
  local_a0 = &local_90;
  puVar1 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar1) {
    local_90 = *puVar1;
    uStack_88 = puVar5[3];
  }
  else {
    local_90 = *puVar1;
    local_a0 = (ulong *)*puVar5;
  }
  local_98 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  expr_peek_abi_cxx11_(&local_60,this);
  uVar6 = 0xf;
  if (local_a0 != &local_90) {
    uVar6 = local_90;
  }
  if (uVar6 < local_60._M_string_length + local_98) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      uVar7 = local_60.field_2._M_allocated_capacity;
    }
    if (local_60._M_string_length + local_98 <= (ulong)uVar7) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_a0);
      goto LAB_001204e4;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60._M_dataplus._M_p);
LAB_001204e4:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar2) {
    uVar7 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar2;
  puVar5[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::expr_peek_save () const
{
	return opts->yych + " = " + opts.yychConversion () + expr_peek ();
}